

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_TtComputeForCut(Jf_Man_t *p,int iFuncLit0,int iFuncLit1,int *pCut0,int *pCut1,int *pCutOut)

{
  uint nVars;
  Vec_Mem_t *pVVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  word uTruth [4];
  word uTruth1 [4];
  word uTruth0 [4];
  word local_a8 [4];
  ulong local_88;
  Jf_Man_t *local_80;
  word local_78 [4];
  word local_58 [5];
  
  nVars = p->pPars->nLutSize;
  iVar4 = nVars - 6;
  uVar12 = 1 << ((byte)iVar4 & 0x1f);
  uVar15 = 1;
  if (6 < (int)nVars) {
    uVar15 = (ulong)uVar12;
  }
  if (iFuncLit0 < 0) {
LAB_00751715:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  pVVar1 = p->vTtMem;
  uVar7 = (uint)iFuncLit0 >> 1;
  if ((int)uVar7 < pVVar1->nEntries) {
    bVar3 = (byte)pVVar1->LogPageSze;
    if (iFuncLit1 < 0) goto LAB_00751715;
    uVar13 = (uint)iFuncLit1 >> 1;
    if ((int)uVar13 < pVVar1->nEntries) {
      iVar6 = (uVar7 & pVVar1->PageMask) * pVVar1->nEntrySize;
      pwVar11 = pVVar1->ppPages[uVar7 >> (bVar3 & 0x1f)];
      iVar14 = (pVVar1->PageMask & uVar13) * pVVar1->nEntrySize;
      pwVar10 = pVVar1->ppPages[uVar13 >> (bVar3 & 0x1f)];
      iVar5 = (int)uVar15;
      if ((iFuncLit0 & 1U) == 0) {
        if (0 < iVar5) {
          uVar9 = 0;
          do {
            local_58[uVar9] = pwVar11[(long)iVar6 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
        }
      }
      else if (0 < iVar5) {
        uVar9 = 0;
        do {
          local_58[uVar9] = ~pwVar11[(long)iVar6 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      local_80 = p;
      if ((iFuncLit1 & 1U) == 0) {
        if (0 < iVar5) {
          uVar9 = 0;
          do {
            local_78[uVar9] = pwVar10[(long)iVar14 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
        }
      }
      else if (0 < iVar5) {
        uVar9 = 0;
        do {
          local_78[uVar9] = ~pwVar10[(long)iVar14 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      uVar7 = (*pCut0 & 0xfU) - 1;
      uVar9 = (ulong)(uint)*pCutOut & 0xf;
      if ((*pCutOut & 0xfU) != 0 && (*pCut0 & 0xfU) != 0) {
        do {
          uVar8 = uVar9 - 1;
          if (pCutOut[uVar9] <= pCut0[(ulong)uVar7 + 1]) {
            if (pCutOut[uVar9] != pCut0[(ulong)uVar7 + 1]) goto LAB_007516f6;
            if ((long)(int)uVar7 < (long)uVar8) {
              Abc_TtSwapVars(local_58,nVars,uVar7,(int)uVar8);
            }
            uVar7 = uVar7 - 1;
          }
        } while ((1 < (long)uVar9) && (uVar9 = uVar8, -1 < (int)uVar7));
      }
      if (uVar7 == 0xffffffff) {
        uVar7 = (*pCut1 & 0xfU) - 1;
        if ((*pCutOut & 0xfU) != 0 && (*pCut1 & 0xfU) != 0) {
          uVar9 = (ulong)(uint)*pCutOut & 0xf;
          do {
            uVar8 = uVar9 - 1;
            if (pCutOut[uVar9] <= pCut1[(ulong)uVar7 + 1]) {
              if (pCutOut[uVar9] != pCut1[(ulong)uVar7 + 1]) {
LAB_007516f6:
                __assert_fail("pCut[i] == pCut0[k]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
              }
              if ((long)(int)uVar7 < (long)uVar8) {
                Abc_TtSwapVars(local_78,nVars,uVar7,(int)uVar8);
              }
              uVar7 = uVar7 - 1;
            }
          } while ((1 < (long)uVar9) && (uVar9 = uVar8, -1 < (int)uVar7));
        }
        if (uVar7 == 0xffffffff) {
          uVar7 = (uint)local_78[0] & (uint)local_58[0] & 1;
          if (uVar7 == 0) {
            if (0 < iVar5) {
              uVar9 = 0;
              do {
                local_a8[uVar9] = local_78[uVar9] & local_58[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar15 != uVar9);
            }
          }
          else if (0 < iVar5) {
            uVar9 = 0;
            do {
              local_a8[uVar9] = ~(local_78[uVar9] & local_58[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar15 != uVar9);
          }
          uVar13 = *pCutOut;
          if ((int)nVars < (int)uVar13) {
            __assert_fail("nVars <= nVarsAll",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
          }
          local_88 = (ulong)uVar7;
          if ((int)uVar13 < 1) {
            iVar6 = 0;
          }
          else {
            uVar7 = uVar12;
            if ((int)uVar12 < 2) {
              uVar7 = 1;
            }
            uVar15 = 0;
            iVar6 = 0;
            do {
              if (uVar15 == nVars) {
                __assert_fail("iVar < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x582,"int Abc_TtHasVar(word *, int, int)");
              }
              if ((int)nVars < 7) {
                if ((s_Truths6Neg[uVar15] &
                    (CONCAT71(local_a8[0]._1_7_,(byte)local_a8[0]) >>
                     ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x3f) ^
                    CONCAT71(local_a8[0]._1_7_,(byte)local_a8[0]))) != 0) {
LAB_0075158f:
                  if ((long)iVar6 < (long)uVar15) {
                    pCutOut[(long)iVar6 + 1] = pCutOut[uVar15 + 1];
                    Abc_TtSwapVars(local_a8,nVars,iVar6,(int)uVar15);
                  }
                  iVar6 = iVar6 + 1;
                }
              }
              else if (uVar15 < 6) {
                if (iVar4 != 0x1f) {
                  uVar9 = 0;
                  do {
                    if (((local_a8[uVar9] >> ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x3f) ^
                         local_a8[uVar9]) & s_Truths6Neg[uVar15]) != 0) goto LAB_0075158f;
                    uVar9 = uVar9 + 1;
                  } while (uVar7 != uVar9);
                }
              }
              else if (iVar4 != 0x1f) {
                bVar3 = (byte)(uVar15 - 6);
                uVar2 = 1 << (bVar3 & 0x1f);
                iVar5 = 2 << (bVar3 & 0x1f);
                uVar9 = 1;
                if (1 < (int)uVar2) {
                  uVar9 = (ulong)uVar2;
                }
                pwVar10 = local_a8 + (int)uVar2;
                pwVar11 = local_a8;
                do {
                  if (uVar15 - 6 != 0x1f) {
                    uVar8 = 0;
                    do {
                      if (pwVar11[uVar8] != pwVar10[uVar8]) goto LAB_0075158f;
                      uVar8 = uVar8 + 1;
                    } while (uVar9 != uVar8);
                  }
                  pwVar11 = pwVar11 + iVar5;
                  pwVar10 = pwVar10 + iVar5;
                } while (pwVar11 < local_a8 + (int)uVar12);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar13);
          }
          if ((int)uVar13 < iVar6) {
            __assert_fail("k < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
          }
          *pCutOut = iVar6;
          if (((byte)local_a8[0] & 1) != 0) {
            __assert_fail("(uTruth[0] & 1) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                          ,0x43d,"int Jf_TtComputeForCut(Jf_Man_t *, int, int, int *, int *, int *)"
                         );
          }
          iVar4 = Vec_MemHashInsert(local_80->vTtMem,local_a8);
          if (iVar4 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          return (int)local_88 + iVar4 * 2;
        }
      }
      __assert_fail("k == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
}

Assistant:

int Jf_TtComputeForCut( Jf_Man_t * p, int iFuncLit0, int iFuncLit1, int * pCut0, int * pCut1, int * pCutOut )
{
    word uTruth[JF_WORD_MAX], uTruth0[JF_WORD_MAX], uTruth1[JF_WORD_MAX];
    int fCompl, truthId;
    int LutSize    = p->pPars->nLutSize;
    int nWords     = Abc_Truth6WordNum(p->pPars->nLutSize);
    word * pTruth0 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit0));
    word * pTruth1 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit1));
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(iFuncLit0) );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(iFuncLit1) );
    Abc_TtExpand( uTruth0, LutSize, pCut0 + 1, Jf_CutSize(pCut0), pCutOut + 1, Jf_CutSize(pCutOut) );
    Abc_TtExpand( uTruth1, LutSize, pCut1 + 1, Jf_CutSize(pCut1), pCutOut + 1, Jf_CutSize(pCutOut) );
    fCompl         = (int)(uTruth0[0] & uTruth1[0] & 1);
    Abc_TtAnd( uTruth, uTruth0, uTruth1, nWords, fCompl );
    pCutOut[0]     = Abc_TtMinBase( uTruth, pCutOut + 1, pCutOut[0], LutSize );
    assert( (uTruth[0] & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    return Abc_Var2Lit( truthId, fCompl );
}